

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O1

Diagnostics * __thiscall
slang::ast::ASTDiagMap::coalesce
          (Diagnostics *__return_storage_ptr__,ASTDiagMap *this,SourceManager *sourceManager)

{
  char_pointer puVar1;
  Diagnostic *pDVar2;
  pointer __x;
  uint uVar3;
  char_pointer puVar4;
  bool bVar5;
  undefined7 extraout_var;
  Diagnostic *pDVar6;
  DefinitionSymbol *pDVar7;
  char_pointer puVar8;
  uint uVar9;
  CheckerInstanceBodySymbol *checkerBody;
  Symbol *pSVar10;
  int iVar11;
  iterator __begin4;
  Diagnostic *rhs;
  _Storage<unsigned_long,_true> _Var12;
  Scope *pSVar13;
  table_element_pointer ppVar14;
  byte bVar15;
  iterator __end4;
  Diagnostic *this_00;
  pointer __x_00;
  undefined1 auVar16 [16];
  iterator iVar17;
  string_view arg;
  InstanceSymbol *local_d0;
  Diagnostic local_c8;
  _Storage<unsigned_long,_true> local_58;
  char_pointer local_50;
  undefined8 local_48;
  SourceManager *local_40;
  table_element_pointer local_38;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_40 = sourceManager;
  iVar17 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                    *)this);
joined_r0x004daae3:
  ppVar14 = iVar17.p_;
  local_50 = iVar17.pc_;
  if (ppVar14 == (table_element_pointer)0x0) {
    if (local_40 != (SourceManager *)0x0) {
      Diagnostics::sort(__return_storage_ptr__,local_40);
    }
    return __return_storage_ptr__;
  }
  rhs = (ppVar14->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (ppVar14->second).
           super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ppVar14->first).super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
      super__Tuple_impl<1UL,_slang::SourceLocation>.
      super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl ==
      (SourceLocation)0xffffffffffffffff) {
    for (; rhs != pDVar2; rhs = rhs + 1) {
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic&>
                ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,rhs);
    }
  }
  else {
    if (rhs == pDVar2) {
      _Var12._M_value = 0;
      bVar15 = 0;
      local_d0 = (InstanceSymbol *)0x0;
      this_00 = (Diagnostic *)0x0;
    }
    else {
      this_00 = (Diagnostic *)0x0;
      local_d0 = (InstanceSymbol *)0x0;
      local_48 = 0;
      local_58._M_value = 0;
      do {
        local_38 = iVar17.p_;
        local_50 = iVar17.pc_;
        if (this_00 == (Diagnostic *)0x0) {
LAB_004dab76:
          pSVar10 = rhs->symbol;
          iVar11 = 7;
          while( true ) {
            local_38 = iVar17.p_;
            local_50 = iVar17.pc_;
            if (pSVar10 == (Symbol *)0x0) break;
            if (pSVar10->kind == CheckerInstanceBody) {
              pSVar13 = (Scope *)pSVar10[1].originatingSyntax[1].parent;
              if (((ulong)pSVar10[2].name._M_str & 0x10000000000) == 0) {
                pDVar6 = Diagnostic::addNote(rhs,(DiagCode)0x540008,
                                             *(SourceLocation *)(pSVar10[1].originatingSyntax + 1));
                arg._M_str = "checker";
                arg._M_len = 7;
                pDVar6 = Diagnostic::operator<<(pDVar6,arg);
                Diagnostic::operator<<(pDVar6,*(string_view *)(*(long *)(pSVar10 + 2) + 8));
                iVar17.p_ = local_38;
                iVar17.pc_ = local_50;
              }
            }
            else {
              if (pSVar10->kind == InstanceBody) {
                local_58._M_value = local_58._M_value + 1;
                pSVar13 = (((InstanceSymbol *)pSVar10[1].originatingSyntax)->
                          super_InstanceSymbolBase).super_Symbol.parentScope;
                iVar11 = 0;
                if ((pSVar13 != (Scope *)0x0) &&
                   ((pSVar13->thisSym->kind | Definition) != CompilationUnit)) {
                  this_00 = rhs;
                  local_d0 = (InstanceSymbol *)pSVar10[1].originatingSyntax;
                }
                break;
              }
              pSVar13 = pSVar10->parentScope;
            }
            if (pSVar13 == (Scope *)0x0) {
              pSVar10 = (Symbol *)0x0;
            }
            else {
              pSVar10 = pSVar13->thisSym;
            }
          }
        }
        else {
          bVar5 = Diagnostic::operator==(this_00,rhs);
          iVar17.p_ = local_38;
          iVar17.pc_ = local_50;
          if (bVar5) goto LAB_004dab76;
          iVar11 = 6;
          local_48 = CONCAT71(extraout_var,1);
        }
        local_38 = iVar17.p_;
      } while (((iVar11 == 7) || (iVar11 == 0)) && (rhs = rhs + 1, rhs != pDVar2));
      bVar15 = (byte)local_48;
      _Var12 = local_58;
    }
    ppVar14 = iVar17.p_;
    local_50 = iVar17.pc_;
    if ((this_00 == (Diagnostic *)0x0 || (bVar15 & 1) != 0) ||
       (pDVar7 = InstanceSymbol::getDefinition(local_d0), pDVar7->instanceCount <= _Var12._M_value))
    {
      __x = (ppVar14->second).
            super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
            super__Vector_impl_data._M_start;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::vector(&local_c8.args,&__x->args);
      std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                (&local_c8.ranges,&__x->ranges);
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                (&local_c8.notes,&__x->notes);
      local_c8.symbol = __x->symbol;
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged =
           (__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ =
           *(undefined7 *)
            &(__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>.field_0x9;
      local_c8.code = __x->code;
      local_c8._92_4_ = *(undefined4 *)&__x->field_0x5c;
      local_c8.location = __x->location;
      if ((bVar15 & 1) != 0) {
        local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
        if (local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == false) {
          local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = true;
        }
      }
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_c8);
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_c8.notes);
      if (local_c8.ranges.
          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.ranges.
                        super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.ranges.
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.ranges.
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::~vector(&local_c8.args);
      while (__x_00 = __x + 1,
            __x_00 != (ppVar14->second).
                      super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::vector(&local_c8.args,&__x_00->args);
        std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                  (&local_c8.ranges,&__x[1].ranges);
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                  (&local_c8.notes,&__x[1].notes);
        local_c8.symbol = __x[1].symbol;
        local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload =
             __x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged =
             __x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._9_7_ =
             *(undefined7 *)
              &__x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>.field_0x9;
        local_c8.code = __x[1].code;
        local_c8._92_4_ = *(undefined4 *)&__x[1].field_0x5c;
        local_c8.location = __x[1].location;
        bVar5 = Diagnostic::operator==
                          (&local_c8,
                           (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                           super_SmallVectorBase<slang::Diagnostic>.data_ +
                           ((__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                            super_SmallVectorBase<slang::Diagnostic>.len - 1));
        if (!bVar5) {
          if ((bVar15 & 1) != 0) {
            local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
            if (local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged == false) {
              local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged = true;
            }
          }
          SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                    ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_c8);
        }
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_c8.notes)
        ;
        if (local_c8.ranges.
            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::~vector(&local_c8.args);
        __x = __x_00;
      }
    }
    else {
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::vector(&local_c8.args,&this_00->args);
      std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                (&local_c8.ranges,&this_00->ranges);
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                (&local_c8.notes,&this_00->notes);
      local_c8.code = this_00->code;
      local_c8._92_4_ = *(undefined4 *)&this_00->field_0x5c;
      local_c8.location = this_00->location;
      local_c8.symbol = (Symbol *)local_d0;
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ =
           SUB87((ulong)*(undefined8 *)
                         &(this_00->coalesceCount).super__Optional_base<unsigned_long,_true,_true>.
                          _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged >> 8,0);
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
      local_c8.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload = _Var12;
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_c8);
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_c8.notes);
      if (local_c8.ranges.
          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.ranges.
                        super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.ranges.
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.ranges.
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::~vector(&local_c8.args);
    }
  }
  puVar4 = local_50 + 2;
  do {
    puVar8 = puVar4;
    ppVar14 = ppVar14 + 1;
    if (((uint)local_50 & 0xf) == 0xe) goto LAB_004daf07;
    puVar1 = puVar8 + -1;
    local_50 = local_50 + 1;
    puVar4 = puVar8 + 1;
  } while (*puVar1 == '\0');
  puVar8 = puVar8 + -1;
  if (*puVar1 == '\x01') {
    ppVar14 = (table_element_pointer)0x0;
  }
  goto LAB_004dad7b;
LAB_004daf07:
  do {
    auVar16[0] = -(*puVar8 == '\0');
    auVar16[1] = -(puVar8[1] == '\0');
    auVar16[2] = -(puVar8[2] == '\0');
    auVar16[3] = -(puVar8[3] == '\0');
    auVar16[4] = -(puVar8[4] == '\0');
    auVar16[5] = -(puVar8[5] == '\0');
    auVar16[6] = -(puVar8[6] == '\0');
    auVar16[7] = -(puVar8[7] == '\0');
    auVar16[8] = -(puVar8[8] == '\0');
    auVar16[9] = -(puVar8[9] == '\0');
    auVar16[10] = -(puVar8[10] == '\0');
    auVar16[0xb] = -(puVar8[0xb] == '\0');
    auVar16[0xc] = -(puVar8[0xc] == '\0');
    auVar16[0xd] = -(puVar8[0xd] == '\0');
    auVar16[0xe] = -(puVar8[0xe] == '\0');
    auVar16[0xf] = -(puVar8[0xf] == '\0');
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    if (uVar9 == 0x7fff) {
      puVar8 = puVar8 + 0x10;
      ppVar14 = ppVar14 + 0xf;
    }
    else {
      uVar3 = 0;
      if ((uVar9 ^ 0x7fff) != 0) {
        for (; ((uVar9 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (puVar8[uVar3] == '\x01') {
        ppVar14 = (table_element_pointer)0x0;
      }
      else {
        puVar8 = puVar8 + uVar3;
        ppVar14 = ppVar14 + uVar3;
      }
    }
  } while (uVar9 == 0x7fff);
LAB_004dad7b:
  iVar17.p_ = ppVar14;
  iVar17.pc_ = puVar8;
  goto joined_r0x004daae3;
}

Assistant:

Diagnostics ASTDiagMap::coalesce(const SourceManager* sourceManager) {
    Diagnostics results;
    for (auto& [key, diagList] : map) {
        // If the location is NoLocation, just issue each diagnostic.
        if (std::get<1>(key) == SourceLocation::NoLocation) {
            for (auto& diag : diagList)
                results.emplace_back(diag);
            continue;
        }

        // Try to find a diagnostic in an instance that isn't at the top-level
        // (printing such a path seems silly).
        const Diagnostic* found = nullptr;
        const Symbol* inst = nullptr;
        size_t count = 0;
        bool differingArgs = false;

        for (auto& diag : diagList) {
            if (found && *found != diag) {
                differingArgs = true;
                break;
            }

            auto symbol = diag.symbol;
            while (symbol && symbol->kind != SymbolKind::InstanceBody) {
                const Scope* scope;
                if (symbol->kind == SymbolKind::CheckerInstanceBody) {
                    auto& checkerBody = symbol->as<CheckerInstanceBodySymbol>();
                    SLANG_ASSERT(checkerBody.parentInstance);
                    scope = checkerBody.parentInstance->getParentScope();

                    // Add an expansion note to the diagnostic since
                    // we won't have added it yet for the checker.
                    if (!checkerBody.flags.has(InstanceFlags::Uninstantiated)) {
                        diag.addNote(diag::NoteWhileExpanding, checkerBody.parentInstance->location)
                            << "checker"sv << checkerBody.checker.name;
                    }
                }
                else {
                    scope = symbol->getParentScope();
                }

                symbol = scope ? &scope->asSymbol() : nullptr;
            }

            if (!symbol)
                continue;

            auto parent = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(parent);

            count++;
            if (auto scope = parent->getParentScope()) {
                auto& sym = scope->asSymbol();
                if (sym.kind != SymbolKind::Root && sym.kind != SymbolKind::CompilationUnit) {
                    found = &diag;
                    inst = parent;
                }
            }
        }

        if (!differingArgs && found &&
            inst->as<InstanceSymbol>().getDefinition().getInstanceCount() > count) {
            // The diagnostic is present only in some instances, so include the coalescing
            // information to point the user towards the right ones.
            Diagnostic diag = *found;
            diag.symbol = inst;
            diag.coalesceCount = count;
            results.emplace_back(std::move(diag));
        }
        else {
            // Otherwise no coalescing. If we had differing arguments then set each
            // diagnostic's coalesce count to 1 (as opposed to letting it stay nullopt)
            // so that we get the instance path to it printed automatically.
            auto it = diagList.begin();
            SLANG_ASSERT(it != diagList.end());

            {
                Diagnostic d = *it;
                if (differingArgs)
                    d.coalesceCount = 1;
                results.emplace_back(std::move(d));
            }

            for (++it; it != diagList.end(); ++it) {
                Diagnostic d = *it;
                if (d != results.back()) {
                    if (differingArgs)
                        d.coalesceCount = 1;
                    results.emplace_back(std::move(d));
                }
            }
        }
    }

    if (sourceManager)
        results.sort(*sourceManager);

    return results;
}